

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O0

void insertDeepSlice<Imath_3_2::half>
               (Box2i *dataWindow,DeepFrameBuffer *frameBuffer,char *name,PixelType pixelType,
               list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
               *channels)

{
  PixelType in_ECX;
  DeepSlice *in_RDX;
  char *in_RSI;
  int *in_RDI;
  char *base;
  Array2D<Imath_3_2::half_*> *buffer;
  size_t height;
  size_t width;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  long in_stack_ffffffffffffff68;
  Array2D<Imath_3_2::half_*> *in_stack_ffffffffffffff70;
  DeepSlice local_80 [56];
  half **local_48;
  Array2D<Imath_3_2::half_*> *local_40;
  long local_38;
  long local_30;
  PixelType local_1c;
  DeepSlice *local_18;
  char *local_10;
  int *local_8;
  
  local_30 = (long)((in_RDI[2] - *in_RDI) + 1);
  local_38 = (long)((in_RDI[3] - in_RDI[1]) + 1);
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::
  list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>::
  emplace_back<>((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_40 = std::__cxx11::
             list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
             ::back((list<Imf_3_4::Array2D<Imath_3_2::half_*>,_std::allocator<Imf_3_4::Array2D<Imath_3_2::half_*>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  Imf_3_4::Array2D<Imath_3_2::half_*>::resizeErase
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_48 = Imf_3_4::Array2D<Imath_3_2::half_*>::operator[](local_40,0);
  local_48 = local_48 + (-(long)*local_8 - local_8[1] * local_30);
  Imf_3_4::DeepSlice::DeepSlice
            (local_80,local_1c,(char *)local_48,8,local_30 << 3,2,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insert(local_10,local_18);
  return;
}

Assistant:

void
insertDeepSlice (
    Box2i&                     dataWindow,
    DeepFrameBuffer&           frameBuffer,
    const char                 name[],
    PixelType                  pixelType,
    list<Array2D<ValueType*>>& channels)
{
    //
    // Allocate a pixel buffer and describe the layout of
    // the buffer in the DeepFrameBuffer object.
    //

    size_t width  = dataWindow.max.x - dataWindow.min.x + 1;
    size_t height = dataWindow.max.y - dataWindow.min.y + 1;

    channels.emplace_back ();
    Array2D<ValueType*>& buffer = channels.back ();
    buffer.resizeErase (height, width);

    char* base =
        (char*) (&buffer[0][0] - dataWindow.min.x - dataWindow.min.y * width);

    frameBuffer.insert (
        name, // name
        DeepSlice (
            pixelType,                   // type
            base,                        // base
            sizeof (ValueType*) * 1,     // xStride
            sizeof (ValueType*) * width, // yStride
            sizeof (ValueType)           // sample stride
            ));
}